

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_int,unsigned_int(*&)(unsigned_int,unsigned_int)>
          (Memory *this,u64 offset,u64 addend,uint rhs,BinopFunc<unsigned_int,_unsigned_int> **func,
          uint *out)

{
  Result RVar1;
  uint val;
  Enum EVar2;
  uint lhs;
  uint *local_38;
  
  local_38 = out;
  RVar1 = AtomicLoad<unsigned_int>(this,offset,addend,&lhs);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    val = (**func)(lhs,rhs);
    RVar1 = AtomicStore<unsigned_int>(this,offset,addend,val);
    if (RVar1.enum_ != Error) {
      *local_38 = lhs;
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}